

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int rtreeShadowName(char *zName)

{
  int iVar1;
  uint i;
  undefined4 in_stack_ffffffffffffffe8;
  uint uVar2;
  
  uVar2 = 0;
  while( true ) {
    if (2 < uVar2) {
      return 0;
    }
    iVar1 = sqlite3_stricmp((char *)CONCAT44(uVar2,in_stack_ffffffffffffffe8),(char *)0x298b62);
    if (iVar1 == 0) break;
    uVar2 = uVar2 + 1;
  }
  return 1;
}

Assistant:

static int rtreeShadowName(const char *zName){
  static const char *azName[] = {
    "node", "parent", "rowid"
  };
  unsigned int i;
  for(i=0; i<sizeof(azName)/sizeof(azName[0]); i++){
    if( sqlite3_stricmp(zName, azName[i])==0 ) return 1;
  }
  return 0;
}